

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

int cvDoErrorTest(CVodeMem cv_mem,int *nflagPtr,sunrealtype saved_t,sunrealtype acor_nrm,int *nefPtr
                 ,long *netfPtr,sunrealtype *dsmPtr)

{
  sunrealtype sVar1;
  sunrealtype *psVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  dVar6 = acor_nrm * cv_mem->cv_tq[2];
  *dsmPtr = dVar6;
  if (dVar6 <= 1.0) {
    return 0;
  }
  *nefPtr = *nefPtr + 1;
  *netfPtr = *netfPtr + 1;
  *nflagPtr = 9;
  cvRestore(cv_mem,saved_t);
  dVar9 = ABS(cv_mem->cv_h);
  if (dVar9 <= cv_mem->cv_hmin * 1.000001) {
    return -3;
  }
  iVar3 = *nefPtr;
  if (iVar3 == cv_mem->cv_maxnef) {
    return -3;
  }
  cv_mem->cv_etamax = 1.0;
  if (iVar3 < 4) {
    dVar6 = pow(dVar6 * 6.0,1.0 / (double)cv_mem->cv_L);
    auVar10._8_8_ = cv_mem->cv_hmin;
    auVar10._0_8_ = 0x3ff0000000000000;
    auVar11._8_8_ = ABS(cv_mem->cv_h);
    auVar11._0_8_ = dVar6 + 1e-06;
    auVar11 = divpd(auVar10,auVar11);
    dVar6 = auVar11._0_8_;
    if (auVar11._0_8_ <= auVar11._8_8_) {
      dVar6 = auVar11._8_8_;
    }
    dVar9 = cv_mem->cv_eta_min_ef;
    if (cv_mem->cv_eta_min_ef <= dVar6) {
      dVar9 = dVar6;
    }
    cv_mem->cv_eta = dVar9;
    if (cv_mem->cv_small_nef <= *nefPtr) {
      if (cv_mem->cv_eta_max_ef <= dVar9) {
        dVar9 = cv_mem->cv_eta_max_ef;
      }
      cv_mem->cv_eta = dVar9;
    }
  }
  else {
    dVar9 = cv_mem->cv_hmin / dVar9;
    dVar6 = cv_mem->cv_eta_min_ef;
    if (cv_mem->cv_eta_min_ef <= dVar9) {
      dVar6 = dVar9;
    }
    cv_mem->cv_eta = dVar6;
    if (cv_mem->cv_q < 2) {
      dVar6 = cv_mem->cv_h * dVar6;
      cv_mem->cv_h = dVar6;
      cv_mem->cv_next_h = dVar6;
      cv_mem->cv_hscale = dVar6;
      cv_mem->cv_qwait = 10;
      cv_mem->cv_nscon = 0;
      iVar3 = (*cv_mem->cv_f)(cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_tempv,cv_mem->cv_user_data);
      cv_mem->cv_nfe = cv_mem->cv_nfe + 1;
      if (iVar3 < 0) {
        return -8;
      }
      if (iVar3 != 0) {
        return -0xb;
      }
      N_VScale(cv_mem->cv_h,cv_mem->cv_tempv,cv_mem->cv_zn[1]);
      if (cv_mem->cv_quadr != 0) {
        iVar3 = (*cv_mem->cv_fQ)(cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_tempvQ,
                                 cv_mem->cv_user_data);
        cv_mem->cv_nfQe = cv_mem->cv_nfQe + 1;
        if (iVar3 < 0) {
          return -0x1f;
        }
        if (iVar3 != 0) {
          return -0x22;
        }
        N_VScale(cv_mem->cv_h,cv_mem->cv_tempvQ,cv_mem->cv_znQ[1]);
      }
      if (cv_mem->cv_sensi != 0) {
        iVar3 = cvSensRhsWrapper(cv_mem,cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_tempv,
                                 cv_mem->cv_znS[0],cv_mem->cv_tempvS,cv_mem->cv_ftemp,
                                 *cv_mem->cv_ftempS);
        auVar11 = _DAT_00139040;
        if (iVar3 < 0) {
          return -0x29;
        }
        if (iVar3 != 0) {
          return -0x2c;
        }
        iVar3 = cv_mem->cv_Ns;
        lVar5 = (long)iVar3;
        psVar2 = cv_mem->cv_cvals;
        if (0 < lVar5) {
          sVar1 = cv_mem->cv_h;
          lVar4 = lVar5 + -1;
          auVar7._8_4_ = (int)lVar4;
          auVar7._0_8_ = lVar4;
          auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
          lVar4 = 0;
          auVar7 = auVar7 ^ _DAT_00139040;
          auVar14 = _DAT_00139030;
          do {
            auVar13 = auVar14 ^ auVar11;
            if ((bool)(~(auVar13._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar13._0_4_ ||
                        auVar7._4_4_ < auVar13._4_4_) & 1)) {
              *(sunrealtype *)((long)psVar2 + lVar4) = sVar1;
            }
            if ((auVar13._12_4_ != auVar7._12_4_ || auVar13._8_4_ <= auVar7._8_4_) &&
                auVar13._12_4_ <= auVar7._12_4_) {
              *(sunrealtype *)((long)psVar2 + lVar4 + 8) = sVar1;
            }
            lVar12 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 2;
            auVar14._8_8_ = lVar12 + 2;
            lVar4 = lVar4 + 0x10;
          } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar4);
        }
        iVar3 = N_VScaleVectorArray(lVar5,psVar2,cv_mem->cv_tempvS,cv_mem->cv_znS[1]);
        if (iVar3 != 0) {
          return -0x1c;
        }
      }
      if (cv_mem->cv_quadr_sensi == 0) {
        return 5;
      }
      iVar3 = (*cv_mem->cv_fQS)(cv_mem->cv_Ns,cv_mem->cv_tn,cv_mem->cv_zn[0],cv_mem->cv_znS[0],
                                cv_mem->cv_tempvQ,cv_mem->cv_tempvQS,cv_mem->cv_fQS_data,
                                cv_mem->cv_ftemp,cv_mem->cv_ftempQ);
      cv_mem->cv_nfQSe = cv_mem->cv_nfQSe + 1;
      auVar11 = _DAT_00139040;
      if (-1 < iVar3) {
        if (iVar3 != 0) {
          return -0x36;
        }
        iVar3 = cv_mem->cv_Ns;
        lVar5 = (long)iVar3;
        psVar2 = cv_mem->cv_cvals;
        if (0 < lVar5) {
          sVar1 = cv_mem->cv_h;
          lVar4 = lVar5 + -1;
          auVar8._8_4_ = (int)lVar4;
          auVar8._0_8_ = lVar4;
          auVar8._12_4_ = (int)((ulong)lVar4 >> 0x20);
          lVar4 = 0;
          auVar8 = auVar8 ^ _DAT_00139040;
          auVar13 = _DAT_00139030;
          do {
            auVar14 = auVar13 ^ auVar11;
            if ((bool)(~(auVar14._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar14._0_4_ ||
                        auVar8._4_4_ < auVar14._4_4_) & 1)) {
              *(sunrealtype *)((long)psVar2 + lVar4) = sVar1;
            }
            if ((auVar14._12_4_ != auVar8._12_4_ || auVar14._8_4_ <= auVar8._8_4_) &&
                auVar14._12_4_ <= auVar8._12_4_) {
              *(sunrealtype *)((long)psVar2 + lVar4 + 8) = sVar1;
            }
            lVar12 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 2;
            auVar13._8_8_ = lVar12 + 2;
            lVar4 = lVar4 + 0x10;
          } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar4);
        }
        iVar3 = N_VScaleVectorArray(lVar5,psVar2,cv_mem->cv_tempvQS,cv_mem->cv_znQS[1]);
        if (iVar3 == 0) {
          return 5;
        }
        return -0x1c;
      }
      return -0x33;
    }
    cvAdjustOrder(cv_mem,-1);
    iVar3 = cv_mem->cv_q;
    cv_mem->cv_L = iVar3;
    cv_mem->cv_q = iVar3 + -1;
    cv_mem->cv_qwait = iVar3;
  }
  cvRescale(cv_mem);
  return 5;
}

Assistant:

static int cvDoErrorTest(CVodeMem cv_mem, int* nflagPtr, sunrealtype saved_t,
                         sunrealtype acor_nrm, int* nefPtr, long int* netfPtr,
                         sunrealtype* dsmPtr)
{
  sunrealtype dsm;
  int retval, is;
  N_Vector wrk1, wrk2;

  dsm = acor_nrm * cv_mem->cv_tq[2];

  SUNLogDebug(CV_LOGGER, "error-test",
              "step = %li, h = " SUN_FORMAT_G ", dsm = " SUN_FORMAT_G,
              cv_mem->cv_nst, cv_mem->cv_h, dsm);

  /* If est. local error norm dsm passes test, return CV_SUCCESS */
  *dsmPtr = dsm;
  if (dsm <= ONE) { return (CV_SUCCESS); }

  /* Test failed; increment counters, set nflag, and restore zn array */
  (*nefPtr)++;
  (*netfPtr)++;
  *nflagPtr = PREV_ERR_FAIL;
  cvRestore(cv_mem, saved_t);

  /* At maxnef failures or |h| = hmin, return CV_ERR_FAILURE */
  if ((SUNRabs(cv_mem->cv_h) <= cv_mem->cv_hmin * ONEPSM) ||
      (*nefPtr == cv_mem->cv_maxnef))
  {
    return (CV_ERR_FAILURE);
  }

  /* Set etamax = 1 to prevent step size increase at end of this step */
  cv_mem->cv_etamax = ONE;

  /* Set h ratio eta from dsm, rescale, and return for retry of step */
  if (*nefPtr <= MXNEF1)
  {
    cv_mem->cv_eta = ONE / (SUNRpowerR(BIAS2 * dsm, ONE / cv_mem->cv_L) + ADDON);
    cv_mem->cv_eta =
      SUNMAX(cv_mem->cv_eta_min_ef,
             SUNMAX(cv_mem->cv_eta, cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h)));
    if (*nefPtr >= cv_mem->cv_small_nef)
    {
      cv_mem->cv_eta = SUNMIN(cv_mem->cv_eta, cv_mem->cv_eta_max_ef);
    }

    cvRescale(cv_mem);

    SUNLogDebug(CV_LOGGER, "new-step-eta", "eta = " SUN_FORMAT_G, cv_mem->cv_eta);

    return (TRY_AGAIN);
  }

  /* After MXNEF1 failures, force an order reduction and retry step */
  if (cv_mem->cv_q > 1)
  {
    cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_min_ef,
                            cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
    cvAdjustOrder(cv_mem, -1);
    cv_mem->cv_L = cv_mem->cv_q;
    cv_mem->cv_q--;
    cv_mem->cv_qwait = cv_mem->cv_L;
    cvRescale(cv_mem);
    SUNLogDebug(CV_LOGGER, "new-step-eta-mxnef1", "eta = " SUN_FORMAT_G,
                cv_mem->cv_eta);
    return (TRY_AGAIN);
  }

  /* If already at order 1, restart: reload zn, znQ, znS, znQS from scratch */

  cv_mem->cv_eta = SUNMAX(cv_mem->cv_eta_min_ef,
                          cv_mem->cv_hmin / SUNRabs(cv_mem->cv_h));
  cv_mem->cv_h *= cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_qwait  = LONG_WAIT;
  cv_mem->cv_nscon  = 0;

  retval = cv_mem->cv_f(cv_mem->cv_tn, cv_mem->cv_zn[0], cv_mem->cv_tempv,
                        cv_mem->cv_user_data);
  cv_mem->cv_nfe++;
  if (retval < 0) { return (CV_RHSFUNC_FAIL); }
  if (retval > 0) { return (CV_UNREC_RHSFUNC_ERR); }

  N_VScale(cv_mem->cv_h, cv_mem->cv_tempv, cv_mem->cv_zn[1]);

  SUNLogDebug(CV_LOGGER, "new-step-eta-mxnef1-q1", "eta = " SUN_FORMAT_G,
              cv_mem->cv_eta);

  if (cv_mem->cv_quadr)
  {
    retval = cv_mem->cv_fQ(cv_mem->cv_tn, cv_mem->cv_zn[0], cv_mem->cv_tempvQ,
                           cv_mem->cv_user_data);
    cv_mem->cv_nfQe++;
    if (retval < 0) { return (CV_QRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_QRHSFUNC_ERR); }

    N_VScale(cv_mem->cv_h, cv_mem->cv_tempvQ, cv_mem->cv_znQ[1]);
  }

  if (cv_mem->cv_sensi)
  {
    wrk1 = cv_mem->cv_ftemp;
    wrk2 = cv_mem->cv_ftempS[0];

    retval = cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, cv_mem->cv_zn[0],
                              cv_mem->cv_tempv, cv_mem->cv_znS[0],
                              cv_mem->cv_tempvS, wrk1, wrk2);
    if (retval < 0) { return (CV_SRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_SRHSFUNC_ERR); }

    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_h;
    }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_tempvS, cv_mem->cv_znS[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  if (cv_mem->cv_quadr_sensi)
  {
    wrk1 = cv_mem->cv_ftemp;
    wrk2 = cv_mem->cv_ftempQ;

    retval = cv_mem->cv_fQS(cv_mem->cv_Ns, cv_mem->cv_tn, cv_mem->cv_zn[0],
                            cv_mem->cv_znS[0], cv_mem->cv_tempvQ,
                            cv_mem->cv_tempvQS, cv_mem->cv_fQS_data, wrk1, wrk2);
    cv_mem->cv_nfQSe++;
    if (retval < 0) { return (CV_QSRHSFUNC_FAIL); }
    if (retval > 0) { return (CV_UNREC_QSRHSFUNC_ERR); }

    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_h;
    }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_tempvQS, cv_mem->cv_znQS[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (TRY_AGAIN);
}